

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O3

void to_js_print_translation_unit_tree
               (FILE *out,AST_Translation_Unit *translation_unit,Program *program)

{
  Queue_Node *pQVar1;
  
  for (pQVar1 = (translation_unit->components).first; pQVar1 != (Queue_Node *)0x0;
      pQVar1 = pQVar1->prev) {
    to_js_print_ast(out,(AST *)pQVar1->data,program);
    fwrite(";\n",2,1,(FILE *)out);
  }
  return;
}

Assistant:

void to_js_print_translation_unit_tree(FILE* out,struct AST_Translation_Unit *translation_unit,struct Program *program)
{
	struct Queue_Node *it;	
	struct AST* hold;
	for(it=translation_unit->components.first;it!=NULL;it=it->prev)
	{
		hold=(struct AST*)(it->data);
		to_js_print_ast(out,hold,program);

		fprintf(out,";\n");
	}
}